

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texturemanager.cpp
# Opt level: O2

FTextureID __thiscall FTextureManager::AddTexture(FTextureManager *this,FTexture *texture)

{
  char *s;
  uint uVar1;
  int trans;
  TextureHash hasher;
  
  if (texture != (FTexture *)0x0) {
    s = (texture->Name).Chars;
    if (*s == '\0') {
      hasher.HashNext = 0xffffffff;
      uVar1 = hasher.HashNext;
    }
    else {
      uVar1 = MakeKey(s);
      hasher.HashNext = this->HashFirst[(ulong)uVar1 % 0x403];
      uVar1 = (uint)((ulong)uVar1 % 0x403);
    }
    hasher.Texture = texture;
    trans = TArray<FTextureManager::TextureHash,_FTextureManager::TextureHash>::Push
                      (&this->Textures,&hasher);
    TArray<int,_int>::Push(&this->Translation,&trans);
    if (-1 < (int)uVar1) {
      this->HashFirst[uVar1] = trans;
    }
    (texture->id).texnum = trans;
    return (FTextureID)trans;
  }
  return (FTextureID)-1;
}

Assistant:

FTextureID FTextureManager::AddTexture (FTexture *texture)
{
	int bucket;
	int hash;

	if (texture == NULL) return FTextureID(-1);

	// Later textures take precedence over earlier ones

	// Textures without name can't be looked for
	if (texture->Name[0] != '\0')
	{
		bucket = int(MakeKey (texture->Name) % HASH_SIZE);
		hash = HashFirst[bucket];
	}
	else
	{
		bucket = -1;
		hash = -1;
	}

	TextureHash hasher = { texture, hash };
	int trans = Textures.Push (hasher);
	Translation.Push (trans);
	if (bucket >= 0) HashFirst[bucket] = trans;
	return (texture->id = FTextureID(trans));
}